

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::file::Type<8>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<8> *this,StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  int iVar4;
  long *in_R9;
  array<int,_3UL> aVar5;
  StructureDivision local_98;
  long *local_50 [2];
  long local_40 [2];
  
  p_Var1 = &(this->
            super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
            ).sections_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)
   &(this->
    super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
    ).sections_._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->
    super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
    ).sections_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = (division->tail).fields._M_elems[2];
  uVar2 = iVar4 - 0x1c6;
  if ((uVar2 < 6) && ((0x29U >> (uVar2 & 0x1f) & 1) != 0)) {
    Base<njoy::ENDFtk::file::Type<8>,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
    ::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                *)&local_98,
               (Base<njoy::ENDFtk::file::Type<8>,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
                *)division,(StructureDivision *)begin,end,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)lineNumber,in_R9);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
             *)this);
    if ((_Base_ptr)
        local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl != (_Base_ptr)0x0) {
      p_Var3 = (_Base_ptr)
               ((long)&local_98.base.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long> + 8);
      (this->
      super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
      ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)
           local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
      (this->
      super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
      ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl;
      (this->
      super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
      ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
           _M_head_impl;
      (this->
      super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
      ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      *(_Rb_tree_header **)
       (local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl + 8) = p_Var1;
      (this->
      super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
      ).sections_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)local_98.base.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Head_base<0UL,_double,_false>._M_head_impl;
      local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Head_base<3UL,_long,_false>._M_head_impl = 0;
      local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
      local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = (long)p_Var3;
      local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = (double)p_Var3;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                 *)&local_98);
  }
  else {
    if ((division->tail).fields._M_elems[1] == 8) {
      tools::Log::info<char_const*,int,int>
                ("Found unsupported section MF{} MT{} - skipping file",8,iVar4);
      if ((division->tail).fields._M_elems[1] == 8) {
        do {
          iVar4 = (division->tail).fields._M_elems[2];
          do {
            record::Base<njoy::ENDFtk::record::Character<66>>::
            Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((Base<njoy::ENDFtk::record::Character<66>> *)local_50,begin,end);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            aVar5 = record::Tail::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                              (begin,end);
            *lineNumber = *lineNumber + 1;
          } while (aVar5._M_elems[2] == iVar4);
          StructureDivision::
          StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (&local_98,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )begin->_M_current,begin,end,lineNumber);
          (division->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl =
               local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Head_base<1UL,_double,_false>._M_head_impl;
          (division->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl =
               local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
          (division->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl =
               local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
          (division->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
          _M_head_impl = local_98.base.fields.
                         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                         super__Tuple_impl<2UL,_long,_long,_long,_long>.
                         super__Head_base<2UL,_long,_false>._M_head_impl;
          *(_Head_base<5UL,_long,_false> *)
           &(division->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long> =
               local_98.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
          ((_Head_base<4UL,_long,_false> *)
          ((long)&(division->base).fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> + 8))
          ->_M_head_impl =
               CONCAT44(local_98.base.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                        super__Head_base<4UL,_long,_false>._M_head_impl._4_4_,
                        (_Rb_tree_color)
                        local_98.base.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                        super__Head_base<4UL,_long,_false>._M_head_impl);
          (division->tail).fields._M_elems[2] = local_98.tail.fields._M_elems[2];
          *(undefined8 *)(division->tail).fields._M_elems = local_98.tail.fields._M_elems._0_8_;
        } while ((division->tail).fields._M_elems[1] == 8);
      }
    }
    Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
    ::verifyFEND(division,*lineNumber);
  }
  return;
}

Assistant:

Type( StructureDivision& division,
      Iterator& begin, const Iterator& end, long& lineNumber ) : Base() {

  //! @todo remove this and set fields and auxiliary functions in Base to private
  try {

    int MT = division.tail.MT();
    if ( ( division.tail.MT() == 454 ) ||
         ( division.tail.MT() == 457 ) ||
         ( division.tail.MT() == 459 ) ) {

      this->sections_ = read( division, begin, end, lineNumber );
    }
    else {

      int MF = 8;
      if ( division.tail.MF() == MF ) {

        Log::info( "Found unsupported section MF{} MT{} - skipping file", MF, MT );

        while ( division.tail.MF() == MF ) {

          Tail tail( division.tail.MAT(), division.tail.MF(), division.tail.MT() );
          int MT = tail.MT();
          while ( tail.MT() == MT ) {

            Text( begin, end );
            tail = Tail( begin, end, lineNumber );
          }
          division = StructureDivision( begin, end, lineNumber );
        }
      }
      this->verifyFEND( division, lineNumber );
    }
  }
  catch ( std::exception& e ) {

    Log::info("Error while reading File 8");
    throw e;
  }
}